

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Gl_Window.cxx
# Opt level: O0

void __thiscall Fl_Gl_Window::swap_buffers(Fl_Gl_Window *this)

{
  Display *pDVar1;
  Window WVar2;
  Fl_Gl_Window *this_local;
  
  pDVar1 = fl_display;
  WVar2 = fl_xid(&this->super_Fl_Window);
  glXSwapBuffers(pDVar1,WVar2);
  return;
}

Assistant:

void Fl_Gl_Window::swap_buffers() {
#if defined(USE_X11)
  glXSwapBuffers(fl_display, fl_xid(this));
#elif defined(WIN32)
#  if HAVE_GL_OVERLAY
  // Do not swap the overlay, to match GLX:
  BOOL ret = wglSwapLayerBuffers(Fl_X::i(this)->private_dc, WGL_SWAP_MAIN_PLANE);
  DWORD err = GetLastError();;
#  else
  SwapBuffers(Fl_X::i(this)->private_dc);
#  endif
#elif defined(__APPLE_QUARTZ__)
  if(overlay != NULL) {
    // STR# 2944 [1]
    //    Save matrixmode/proj/modelview/rasterpos before doing overlay.
    //
    int wo=pixel_w(), ho=pixel_h();
    GLint matrixmode;
    GLfloat pos[4];
    glGetIntegerv(GL_MATRIX_MODE, &matrixmode);
    glGetFloatv(GL_CURRENT_RASTER_POSITION, pos);       // save original glRasterPos
    glMatrixMode(GL_PROJECTION);			// save proj/model matrices
    glPushMatrix();
      glLoadIdentity();
      glMatrixMode(GL_MODELVIEW);
      glPushMatrix();
        glLoadIdentity();
        glScalef(2.0f/wo, 2.0f/ho, 1.0f);
        glTranslatef(-wo/2.0f, -ho/2.0f, 0.0f);         // set transform so 0,0 is bottom/left of Gl_Window
        glRasterPos2i(0,0);                             // set glRasterPos to bottom left corner
        {
          // Emulate overlay by doing copypixels
          glReadBuffer(GL_BACK);
          glDrawBuffer(GL_FRONT);
          glCopyPixels(0, 0, wo, ho, GL_COLOR);         // copy GL_BACK to GL_FRONT
        }
        glPopMatrix(); // GL_MODELVIEW                  // restore model/proj matrices
      glMatrixMode(GL_PROJECTION);
      glPopMatrix();
    glMatrixMode(matrixmode);
    glRasterPos3f(pos[0], pos[1], pos[2]);              // restore original glRasterPos
  }
  /* // nothing to do here under Cocoa because [NSOpenGLContext -flushBuffer] done later replaces it
   else
    aglSwapBuffers((AGLContext)context_);
   */
#else
# error unsupported platform
#endif
}